

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O2

StringRef __thiscall llvm::Twine::toNullTerminatedStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  NodeKind NVar1;
  size_t sVar2;
  StringRef SVar3;
  StringRef local_28;
  char local_11;
  
  NVar1 = this->LHSKind;
  if (NVar1 < TwineKind || this->RHSKind != EmptyKind) {
LAB_00dc5ce6:
    toVector(this,Out);
    local_11 = '\0';
    SmallVectorTemplateBase<char,_true>::push_back
              (&Out->super_SmallVectorTemplateBase<char,_true>,&local_11);
    SmallVectorTemplateBase<char,_true>::pop_back(&Out->super_SmallVectorTemplateBase<char,_true>);
    sVar2 = (size_t)(Out->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  }
  else {
    if (NVar1 == StdStringKind) {
      Out = (SmallVectorImpl<char> *)(this->LHS).stringRef;
    }
    else {
      if (NVar1 != CStringKind) goto LAB_00dc5ce6;
      Out = (SmallVectorImpl<char> *)&local_28;
      StringRef::StringRef((StringRef *)Out,(this->LHS).cString);
    }
    sVar2 = ((StringRef *)Out)->Length;
  }
  SVar3.Length = sVar2;
  SVar3.Data = ((StringRef *)Out)->Data;
  return SVar3;
}

Assistant:

StringRef Twine::toNullTerminatedStringRef(SmallVectorImpl<char> &Out) const {
  if (isUnary()) {
    switch (getLHSKind()) {
    case CStringKind:
      // Already null terminated, yay!
      return StringRef(LHS.cString);
    case StdStringKind: {
      const std::string *str = LHS.stdString;
      return StringRef(str->c_str(), str->size());
    }
    default:
      break;
    }
  }
  toVector(Out);
  Out.push_back(0);
  Out.pop_back();
  return StringRef(Out.data(), Out.size());
}